

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O2

lzma_filter_decoder * decoder_find(lzma_vli id)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x20 == 0x140) {
      return (lzma_filter_decoder *)0x0;
    }
    lVar1 = lVar2 + 0x20;
  } while (*(lzma_vli *)((long)&decoders[0].id + lVar2) != id);
  return (lzma_filter_decoder *)((long)&decoders[0].id + lVar2);
}

Assistant:

static const lzma_filter_decoder *
decoder_find(lzma_vli id)
{
	for (size_t i = 0; i < ARRAY_SIZE(decoders); ++i)
		if (decoders[i].id == id)
			return decoders + i;

	return NULL;
}